

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O0

void initialize_worker_for_sim<PredictionData<float,long>>
               (WorkerForSimilarity *workspace,PredictionData<float,_long> *prediction_data,
               IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,size_t n_from,
               bool assume_full_distr)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_01;
  bool bVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  byte in_R9B;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  size_type in_stack_ffffffffffffff78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(long *)(in_RDI + 0x20) = *(long *)(in_RSI + 0x10) + -1;
  *(long *)(in_RDI + 0x88) = in_R8;
  *(byte *)(in_RDI + 0x90) = in_R9B & 1;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (bVar1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff58);
    __first._M_current._4_4_ = in_stack_ffffffffffffff74;
    __first._M_current._0_4_ = in_stack_ffffffffffffff70;
    std::
    iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
              (__first,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )in_stack_ffffffffffffff68._M_current,
               (unsigned_long)in_stack_ffffffffffffff60);
    if (in_R8 == 0) {
      in_stack_ffffffffffffff68._M_current = (double *)(in_RDI + 0x58);
      if ((*(ulong *)(in_RSI + 0x10) & 1) == 0) {
        in_stack_ffffffffffffff60 =
             (double *)((*(ulong *)(in_RSI + 0x10) >> 1) * (*(long *)(in_RSI + 0x10) + -1));
      }
      else {
        in_stack_ffffffffffffff60 =
             (double *)(*(long *)(in_RSI + 0x10) * (*(long *)(in_RSI + 0x10) - 1U >> 1));
      }
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (value_type_conflict *)in_stack_ffffffffffffff80);
    }
    else {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (value_type_conflict *)in_stack_ffffffffffffff80);
    }
  }
  if ((in_RDX != 0) &&
     ((*(int *)(in_RDX + 0x20) == 0x15 ||
      (((*(int *)(in_RDX + 0x18) == 0 && (*(int *)(in_RDX + 0x1c) == 0)) &&
       (*(long *)(in_RSI + 8) != 0)))))) {
    bVar1 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (bVar1) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (value_type_conflict *)in_stack_ffffffffffffff80);
    }
    else {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff90 = (vector<double,_std::allocator<double>_> *)0x3ff0000000000000;
      __first_00._M_current._4_4_ = in_stack_ffffffffffffff74;
      __first_00._M_current._0_4_ = in_stack_ffffffffffffff70;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (__first_00,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
  }
  if (in_RCX != 0) {
    bVar1 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (bVar1) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff90,0,(value_type_conflict *)in_stack_ffffffffffffff80);
    }
    else {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff58);
      __first_01._M_current._4_4_ = 0;
      __first_01._M_current._0_4_ = in_stack_ffffffffffffff70;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
                (__first_01,in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60);
    }
  }
  return;
}

Assistant:

void initialize_worker_for_sim(WorkerForSimilarity  &workspace,
                               PredictionData       &prediction_data,
                               IsoForest            *model_outputs,
                               ExtIsoForest         *model_outputs_ext,
                               size_t                n_from,
                               bool                  assume_full_distr)
{
    workspace.st  = 0;
    workspace.end = prediction_data.nrows - 1;
    workspace.n_from = n_from;
    workspace.assume_full_distr = assume_full_distr; /* doesn't need to have one copy per worker */

    if (workspace.ix_arr.empty())
    {
        workspace.ix_arr.resize(prediction_data.nrows);
        std::iota(workspace.ix_arr.begin(), workspace.ix_arr.end(), (size_t)0);
        if (!n_from)
            workspace.tmat_sep.resize(calc_ncomb(prediction_data.nrows), 0);
        else
            workspace.rmat.resize((prediction_data.nrows - n_from) * n_from, 0);
    }

    if (model_outputs != NULL &&
        (model_outputs->missing_action == Divide ||
         (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && prediction_data.categ_data != NULL)))
    {
        if (workspace.weights_arr.empty())
            workspace.weights_arr.resize(prediction_data.nrows, 1.);
        else
            std::fill(workspace.weights_arr.begin(), workspace.weights_arr.end(), 1.);
    }

    if (model_outputs_ext != NULL)
    {
        if (workspace.comb_val.empty())
            workspace.comb_val.resize(prediction_data.nrows, 0);
        else
            std::fill(workspace.comb_val.begin(), workspace.comb_val.end(), 0);
    }
}